

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_init_do(SessionHandle *data,connectdata *conn)

{
  Curl_HttpReq CVar1;
  timeval tVar2;
  
  if (conn != (connectdata *)0x0) {
    (conn->bits).do_more = false;
  }
  (data->state).done = false;
  (data->state).expect100header = false;
  if ((data->set).opt_no_body == false) {
    if ((data->set).httpreq != HTTPREQ_HEAD) goto LAB_0044f8f3;
    CVar1 = HTTPREQ_GET;
  }
  else {
    CVar1 = HTTPREQ_HEAD;
  }
  (data->set).httpreq = CVar1;
LAB_0044f8f3:
  tVar2 = curlx_tvnow();
  (data->req).start = tVar2;
  (data->req).now.tv_sec = (data->req).start.tv_sec;
  (data->req).now.tv_usec = (data->req).start.tv_usec;
  (data->req).header = true;
  (data->req).bytecount = 0;
  (data->req).buf = (data->state).buffer;
  (data->req).uploadbuf = (data->state).uploadbuffer;
  (data->req).hbufp = (data->state).headerbuff;
  (data->req).ignorebody = false;
  Curl_speedinit(data);
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_init_do(struct SessionHandle *data, struct connectdata *conn)
{
  struct SingleRequest *k = &data->req;

  if(conn)
    conn->bits.do_more = FALSE; /* by default there's no curl_do_more() to
                                 * use */

  data->state.done = FALSE; /* Curl_done() is not called yet */
  data->state.expect100header = FALSE;

  if(data->set.opt_no_body)
    /* in HTTP lingo, no body means using the HEAD request... */
    data->set.httpreq = HTTPREQ_HEAD;
  else if(HTTPREQ_HEAD == data->set.httpreq)
    /* ... but if unset there really is no perfect method that is the
       "opposite" of HEAD but in reality most people probably think GET
       then. The important thing is that we can't let it remain HEAD if the
       opt_no_body is set FALSE since then we'll behave wrong when getting
       HTTP. */
    data->set.httpreq = HTTPREQ_GET;

  k->start = Curl_tvnow(); /* start time */
  k->now = k->start;   /* current time is now */
  k->header = TRUE; /* assume header */

  k->bytecount = 0;

  k->buf = data->state.buffer;
  k->uploadbuf = data->state.uploadbuffer;
  k->hbufp = data->state.headerbuff;
  k->ignorebody=FALSE;

  Curl_speedinit(data);

  Curl_pgrsSetUploadCounter(data, 0);
  Curl_pgrsSetDownloadCounter(data, 0);

  return CURLE_OK;
}